

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::all2all<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *msgs,comm *comm)

{
  ulong uVar1;
  mxx *this_00;
  int iVar2;
  comm *in_R8;
  
  this_00 = *(mxx **)this;
  uVar1 = *(long *)(this + 8) - (long)this_00;
  iVar2 = *(int *)&(msgs->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((int)((long)((ulong)(uint)((int)(uVar1 >> 3) >> 0x1f) << 0x20 | uVar1 >> 3 & 0xffffffff) %
           (long)iVar2) != 0) {
    assert_fail("(int)msgs.size() % comm.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,0x4b2,"all2all");
    this_00 = *(mxx **)this;
    iVar2 = *(int *)&(msgs->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar1 = *(long *)(this + 8) - (long)this_00;
  }
  all2all<std::pair<int,int>>
            (__return_storage_ptr__,this_00,
             (pair<int,_int> *)((ulong)((long)uVar1 >> 3) / (ulong)(long)iVar2),(size_t)msgs,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const std::vector<T>& msgs, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT((int)msgs.size() % comm.size() == 0);
    size_t size = msgs.size() / comm.size();
    std::vector<T> result = all2all(&msgs[0], size, comm);
    return result;
}